

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<int,_int,_int,_int,_int,_int>,_testing::internal::CastAndAppendTransform<const_unsigned_int_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>_>
::IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int>,_6UL>::operator()
          (undefined8 param_1,long param_2,
          vector<testing::Matcher<unsigned_int_const&>,std::allocator<testing::Matcher<unsigned_int_const&>>>
          *param_3)

{
  back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
  bVar1;
  uint local_34;
  MatcherBase<const_unsigned_int_&> local_30;
  
  local_34 = *(uint *)(param_2 + 0x14);
  Matcher<const_unsigned_int_&>::Matcher((Matcher<const_unsigned_int_&> *)&local_30,&local_34);
  std::
  vector<testing::Matcher<unsigned_int_const&>,std::allocator<testing::Matcher<unsigned_int_const&>>>
  ::emplace_back<testing::Matcher<unsigned_int_const&>>
            (param_3,(Matcher<const_unsigned_int_&> *)&local_30);
  MatcherBase<const_unsigned_int_&>::~MatcherBase(&local_30);
  bVar1 = IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int>,_5UL>::operator()
                    ((IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int>,_5UL> *)&local_30,
                     param_2,param_3);
  return (back_insert_iterator<std::vector<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }